

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O0

bool __thiscall MemoryManager::addPage(MemoryManager *this,uint32_t addr)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint8_t **ppuVar3;
  uint8_t *puVar4;
  uint in_ESI;
  MemoryManager *in_RDI;
  uint32_t j;
  uint32_t i;
  bool local_1;
  
  uVar1 = getFirstEntryId(in_RDI,in_ESI);
  uVar2 = getSecondEntryId(in_RDI,in_ESI);
  if (in_RDI->memory[uVar1] == (uint8_t **)0x0) {
    ppuVar3 = (uint8_t **)operator_new__(0x2000);
    in_RDI->memory[uVar1] = ppuVar3;
    memset(in_RDI->memory[uVar1],0,0x2000);
  }
  local_1 = in_RDI->memory[uVar1][uVar2] != (uint8_t *)0x0;
  if (local_1) {
    dbgprintf("Addr 0x%x already exists and do not need an addPage()!\n",(ulong)in_ESI);
  }
  else {
    puVar4 = (uint8_t *)operator_new__(0x1000);
    in_RDI->memory[uVar1][uVar2] = puVar4;
    memset(in_RDI->memory[uVar1][uVar2],0,0x1000);
  }
  local_1 = !local_1;
  return local_1;
}

Assistant:

bool MemoryManager::addPage(uint32_t addr) {
  uint32_t i = this->getFirstEntryId(addr);
  uint32_t j = this->getSecondEntryId(addr);
  if (this->memory[i] == nullptr) {
    this->memory[i] = new uint8_t *[1024];
    memset(this->memory[i], 0, sizeof(uint8_t *) * 1024);
  }
  if (this->memory[i][j] == nullptr) {
    this->memory[i][j] = new uint8_t[4096];
    memset(this->memory[i][j], 0, 4096);
  } else {
    dbgprintf("Addr 0x%x already exists and do not need an addPage()!\n", addr);
    return false;
  }
  return true;
}